

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::renderTriangleTest(TestStatus *__return_storage_ptr__,Context *context)

{
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  float *pfVar2;
  TestLog *log;
  TestStatus *__return_storage_ptr___00;
  bool bVar3;
  VkResult VVar4;
  VkDevice device;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  ProgramBinary *pPVar5;
  deUint32 dVar6;
  allocator<char> local_cad;
  deUint32 queueFamilyIndex;
  VkDeviceSize bindingOffset;
  DeviceInterface *pDStack_ca0;
  VkDevice local_c98;
  VkCommandPool VStack_c90;
  undefined8 local_c88;
  deUint64 dStack_c80;
  RefBase<vk::VkCommandBuffer_s_*> *local_c78;
  VkMemoryBarrier *pVStack_c70;
  undefined8 local_c68;
  RefBase<vk::VkCommandBuffer_s_*> local_c58;
  Context *local_c30;
  VkFenceCreateInfo fenceParams;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_bf8;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> readImageBufferMemory;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferMemory;
  VkMemoryBarrier vertFlushBarrier;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_b88;
  TestStatus *local_b60;
  VkQueue local_b58;
  TextureFormat tcuFormat;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> imageMemory;
  IVec3 posDeviation;
  VkSampleMask sampleMask;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_b28;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_b08;
  TextureLevel refImage;
  undefined1 local_ab8 [16];
  RefBase<vk::Handle<(vk::HandleType)24>_> local_aa8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_a88;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_a68;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_a48;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_a28;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_a08;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_9e8;
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  Vec4 local_968;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  VkAttachmentReference colorAttRef;
  UVec4 threshold;
  VkVertexInputBindingDescription vertexBinding0;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D local_898;
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkViewport local_678;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkPipelineColorBlendAttachmentState attBlendParams;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkAttachmentDescription colorAttDesc;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineViewportStateCreateInfo viewportParams;
  VkPipelineColorBlendStateCreateInfo local_4b0;
  VkBufferCreateInfo readImageBufferParams;
  VkBufferCreateInfo vertexBufferParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkFramebufferCreateInfo framebufferParams;
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription local_348;
  VkImageViewCreateInfo local_2f8;
  VkImageCreateInfo local_2a8;
  SimpleAllocator memAlloc;
  
  local_b60 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_b58 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface(context);
  local_c30 = context;
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pipelineParams,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&pipelineParams);
  local_ab8._0_8_ = 0x3e8000003e000000;
  local_ab8._8_8_ = (void *)0x3f8000003f400000;
  local_968.m_data[0] = -0.5;
  local_968.m_data[1] = -0.5;
  local_968.m_data[2] = 0.0;
  local_968.m_data[3] = 1.0;
  local_958 = 0xbf0000003f000000;
  uStack_950 = 0x3f80000000000000;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.pNext = (void *)0x0;
  local_948 = 0x3f00000000000000;
  uStack_940 = 0x3f80000000000000;
  vertexBufferParams.flags = 0;
  vertexBufferParams.size = 0x30;
  vertexBufferParams.usage = 0x80;
  vertexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vertexBufferParams.queueFamilyIndexCount = 1;
  vertexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &vertexBufferParams,(VkAllocationCallbacks *)0x0);
  local_b08.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_b08.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_b08.m_data.object.m_internal = pipelineParams._0_8_;
  local_b08.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,
             (VkBuffer)local_b08.m_data.object.m_internal);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  vertexBufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)depthStencilParams._0_8_;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthStencilParams._4_4_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams)
  ;
  VVar4 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,local_b08.m_data.object.m_internal,
                     ((vertexBufferMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x16a);
  readImageBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  readImageBufferParams.pNext = (void *)0x0;
  readImageBufferParams.flags = 0;
  readImageBufferParams.size = 0x40000;
  readImageBufferParams.usage = 2;
  readImageBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  readImageBufferParams.queueFamilyIndexCount = 1;
  readImageBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &readImageBufferParams,(VkAllocationCallbacks *)0x0);
  local_b88.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_b88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_b88.m_data.object.m_internal = pipelineParams._0_8_;
  local_b88.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,
             (VkBuffer)local_b88.m_data.object.m_internal);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  readImageBufferMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)depthStencilParams._0_8_;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthStencilParams._4_4_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams)
  ;
  VVar4 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,local_b88.m_data.object.m_internal,
                     ((readImageBufferMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x17b);
  local_2a8.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_2a8.pNext = (void *)0x0;
  local_2a8.flags = 0;
  local_2a8.imageType = VK_IMAGE_TYPE_2D;
  local_2a8.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_2a8.extent.width = 0x100;
  local_2a8.extent.height = 0x100;
  local_2a8.extent.depth = 1;
  local_2a8.mipLevels = 1;
  local_2a8.arrayLayers = 1;
  local_2a8.samples = VK_SAMPLE_COUNT_1_BIT;
  local_2a8.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_2a8.usage = 0x11;
  local_2a8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_2a8.queueFamilyIndexCount = 1;
  local_2a8.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_2a8.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&pipelineParams,vk,device,&local_2a8,
                    (VkAllocationCallbacks *)0x0);
  local_bf8.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_bf8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_bf8.m_data.object.m_internal = pipelineParams._0_8_;
  local_bf8.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&pipelineParams);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,
             (VkImage)local_bf8.m_data.object.m_internal);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x0);
  imageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)depthStencilParams._0_8_;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthStencilParams._4_4_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams)
  ;
  VVar4 = (*vk->_vptr_DeviceInterface[0xd])
                    (vk,device,local_bf8.m_data.object.m_internal,
                     ((imageMemory.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal);
  ::vk::checkResult(VVar4,
                    "vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x193);
  renderPassParams.pAttachments = &colorAttDesc;
  colorAttDesc.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttDesc.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttDesc.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttDesc.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttDesc.flags = 0;
  colorAttDesc.format = VK_FORMAT_R8G8B8A8_UNORM;
  colorAttDesc.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttDesc.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttDesc.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_348.pColorAttachments = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  renderPassParams.pSubpasses = &local_348;
  local_348.pInputAttachments = (VkAttachmentReference *)0x0;
  local_348.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_348.pPreserveAttachments = (deUint32 *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  local_348.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_348.preserveAttachmentCount = 0;
  local_348._60_4_ = 0;
  local_348.flags = 0;
  local_348.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_348.inputAttachmentCount = 0;
  local_348._12_4_ = 0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 1;
  dVar6 = 1;
  local_348.colorAttachmentCount = 1;
  local_348._28_4_ = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  renderPassParams.subpassCount = dVar6;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineParams,vk,device,&renderPassParams,
             (VkAllocationCallbacks *)0x0);
  local_b28.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_b28.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_b28.m_data.object.m_internal = pipelineParams._0_8_;
  local_b28.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&pipelineParams);
  local_2f8.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_2f8.pNext = (void *)0x0;
  local_2f8.flags = 0;
  local_2f8.image.m_internal = local_bf8.m_data.object.m_internal;
  local_2f8.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_2f8.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_2f8.components.r = VK_COMPONENT_SWIZZLE_R;
  local_2f8.components.g = VK_COMPONENT_SWIZZLE_G;
  local_2f8.components.b = VK_COMPONENT_SWIZZLE_B;
  local_2f8.components.a = VK_COMPONENT_SWIZZLE_A;
  local_2f8.subresourceRange.aspectMask = 1;
  local_2f8.subresourceRange.baseMipLevel = 0;
  local_2f8.subresourceRange.levelCount = 1;
  local_2f8.subresourceRange.baseArrayLayer = 0;
  local_2f8.subresourceRange.layerCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineParams,vk,device,&local_2f8,
             (VkAllocationCallbacks *)0x0);
  local_9e8.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_9e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_9e8.m_data.object.m_internal = pipelineParams._0_8_;
  local_9e8.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&pipelineParams);
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineParams,vk,device,
             &pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  local_a08.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_a08.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_a08.m_data.object.m_internal = pipelineParams._0_8_;
  local_a08.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&pipelineParams);
  pPVar1 = local_c30->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depthStencilParams,"vert",(allocator<char> *)shaderStageParams);
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,pPVar5,0);
  local_a28.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_a28.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_a28.m_data.object.m_internal = pipelineParams._0_8_;
  local_a28.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams);
  std::__cxx11::string::~string((string *)&depthStencilParams);
  pPVar1 = local_c30->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depthStencilParams,"frag",(allocator<char> *)shaderStageParams);
  pPVar5 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,pPVar5,0);
  local_a48.m_data.deleter.m_device = (VkDevice)pipelineParams._16_8_;
  local_a48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_a48.m_data.object.m_internal = pipelineParams._0_8_;
  local_a48.m_data.deleter.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams);
  std::__cxx11::string::~string((string *)&depthStencilParams);
  shaderStageParams[0].pSpecializationInfo = &emptyShaderSpecParams;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[0].pNext = (void *)0x0;
  emptyShaderSpecParams.dataSize = 0;
  emptyShaderSpecParams.pData = (void *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  shaderStageParams[0].flags = 0;
  shaderStageParams[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStageParams[0].module.m_internal = local_a28.m_data.object.m_internal;
  shaderStageParams[0].pName = "main";
  shaderStageParams[1].pNext = (void *)0x0;
  shaderStageParams[1].flags = 0;
  shaderStageParams[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStageParams[1].module.m_internal = local_a48.m_data.object.m_internal;
  shaderStageParams[1].pName = "main";
  depthStencilParams.pNext = (void *)0x0;
  depthStencilParams.flags = 0;
  depthStencilParams.depthTestEnable = 0;
  depthStencilParams.front.compareMask = 0;
  depthStencilParams.front.writeMask = 0;
  depthStencilParams.back.writeMask = 0;
  depthStencilParams.back.reference = 0;
  depthStencilParams.front.reference = 0;
  depthStencilParams.back.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.depthBoundsTestEnable = 0;
  depthStencilParams.stencilTestEnable = 0;
  depthStencilParams.front.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  depthStencilParams._4_4_ = 0;
  depthStencilParams.depthWriteEnable = 0;
  depthStencilParams.depthCompareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.front.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareMask = 0;
  depthStencilParams.minDepthBounds = 0.0;
  depthStencilParams.maxDepthBounds = 1.0;
  viewportParams.pViewports = &local_678;
  local_678.x = 0.0;
  local_678.y = 0.0;
  local_678.width = 256.0;
  local_678.height = 256.0;
  local_678.minDepth = 0.0;
  local_678.maxDepth = 1.0;
  viewportParams.pScissors = &local_898;
  local_898.offset.x = 0;
  local_898.offset.y = 0;
  local_898.extent.width = 0x100;
  local_898.extent.height = 0x100;
  pipelineParams.pViewportState = &viewportParams;
  viewportParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportParams.pNext = (void *)0x0;
  multisampleParams.pSampleMask = &sampleMask;
  sampleMask = 0xffffffff;
  pipelineParams.pMultisampleState = &multisampleParams;
  multisampleParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleParams.pNext = (void *)0x0;
  viewportParams.flags = 0;
  viewportParams.viewportCount = 1;
  multisampleParams.flags = 0;
  multisampleParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  multisampleParams.sampleShadingEnable = 0;
  multisampleParams.minSampleShading = 0.0;
  multisampleParams.alphaToCoverageEnable = 0;
  multisampleParams.alphaToOneEnable = 0;
  pipelineParams.pRasterizationState = &rasterParams;
  rasterParams.pNext = (void *)0x0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.depthBiasClamp = 0.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterParams._4_4_ = 0;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 1;
  rasterParams.lineWidth = 1.0;
  rasterParams._60_4_ = 0;
  pipelineParams.pInputAssemblyState = &inputAssemblyParams;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyParams.primitiveRestartEnable = 0;
  inputAssemblyParams._28_4_ = 0;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyParams._4_4_ = 0;
  inputAssemblyParams.pNext = (void *)0x0;
  vertexInputStateParams.pVertexBindingDescriptions = &vertexBinding0;
  vertexBinding0.binding = 0;
  vertexBinding0.stride = 0x10;
  vertexBinding0.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputStateParams.pVertexAttributeDescriptions = &vertexAttrib0;
  vertexAttrib0.location = 0;
  vertexAttrib0.binding = 0;
  vertexAttrib0.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttrib0.offset = 0;
  pipelineParams.pVertexInputState = &vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  local_4b0.pAttachments = &attBlendParams;
  attBlendParams.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.alphaBlendOp = VK_BLEND_OP_ADD;
  attBlendParams.colorWriteMask = 0xf;
  attBlendParams.blendEnable = 0;
  attBlendParams.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.colorBlendOp = VK_BLEND_OP_ADD;
  pipelineParams.pColorBlendState = &local_4b0;
  local_4b0.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_4b0.pNext = (void *)0x0;
  local_4b0.flags = 0;
  local_4b0.logicOpEnable = 0;
  pipelineParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 2;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_4b0.logicOp = VK_LOGIC_OP_COPY;
  local_4b0.attachmentCount = 1;
  pipelineParams.layout.m_internal = local_a08.m_data.object.m_internal;
  pipelineParams.renderPass.m_internal = local_b28.m_data.object.m_internal;
  pipelineParams.subpass = 0;
  pipelineParams.basePipelineHandle.m_internal = 0;
  local_4b0.blendConstants[0] = 0.0;
  local_4b0.blendConstants[1] = 0.0;
  local_4b0.blendConstants[2] = 0.0;
  local_4b0.blendConstants[3] = 0.0;
  pipelineParams.basePipelineIndex = 0;
  shaderStageParams[1].sType = shaderStageParams[0].sType;
  shaderStageParams[1].pSpecializationInfo = shaderStageParams[0].pSpecializationInfo;
  pipelineParams.pStages = shaderStageParams;
  pipelineParams.pDepthStencilState = &depthStencilParams;
  vertexInputStateParams.vertexAttributeDescriptionCount = dVar6;
  viewportParams.scissorCount = dVar6;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&bindingOffset,vk,device,(VkPipelineCache)0x0,
             &pipelineParams,(VkAllocationCallbacks *)0x0);
  local_a68.m_data.deleter.m_device = local_c98;
  local_a68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_c90.m_internal;
  local_a68.m_data.object.m_internal = bindingOffset;
  local_a68.m_data.deleter.m_deviceIface = pDStack_ca0;
  bindingOffset = 0;
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x0;
  VStack_c90.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&bindingOffset);
  framebufferParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.pNext = (void *)0x0;
  framebufferParams.flags = 0;
  framebufferParams.renderPass.m_internal = local_b28.m_data.object.m_internal;
  framebufferParams.pAttachments = (VkImageView *)&local_9e8;
  framebufferParams.width = 0x100;
  framebufferParams.height = 0x100;
  framebufferParams.attachmentCount = dVar6;
  framebufferParams.layers = dVar6;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bindingOffset,vk,device,&framebufferParams,
             (VkAllocationCallbacks *)0x0);
  local_a88.m_data.deleter.m_device = local_c98;
  local_a88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_c90.m_internal;
  local_a88.m_data.object.m_internal = bindingOffset;
  local_a88.m_data.deleter.m_deviceIface = pDStack_ca0;
  bindingOffset = 0;
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x0;
  VStack_c90.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&bindingOffset);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  cmdPoolParams.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bindingOffset,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  local_aa8.m_data.deleter.m_device = local_c98;
  local_aa8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)VStack_c90.m_internal;
  local_aa8.m_data.object.m_internal = bindingOffset;
  local_aa8.m_data.deleter.m_deviceIface = pDStack_ca0;
  bindingOffset = 0;
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x0;
  VStack_c90.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&bindingOffset);
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = local_aa8.m_data.object.m_internal;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&bindingOffset,vk,device,&cmdBufParams);
  local_c58.m_data.deleter.m_device = local_c98;
  local_c58.m_data.deleter.m_pool.m_internal = VStack_c90.m_internal;
  local_c58.m_data.object = (VkCommandBuffer_s *)bindingOffset;
  local_c58.m_data.deleter.m_deviceIface = pDStack_ca0;
  bindingOffset = 0;
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x0;
  VStack_c90.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&bindingOffset);
  VVar4 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_c58.m_data.object);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x2de);
  vertFlushBarrier.srcAccessMask = 0x4000;
  vertFlushBarrier.dstAccessMask = 4;
  vertFlushBarrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  vertFlushBarrier._4_4_ = 0;
  vertFlushBarrier.pNext = (void *)0x0;
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2d);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x18000000000;
  VStack_c90.m_internal = 0x200000000;
  local_c88 = CONCAT44(queueFamilyIndex,queueFamilyIndex);
  dStack_c80 = local_bf8.m_data.object.m_internal;
  local_c78 = (RefBase<vk::VkCommandBuffer_s_*> *)0x1;
  pVStack_c70 = (VkMemoryBarrier *)0x1;
  local_c68._0_4_ = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_c58.m_data.object,0x4000,0x10000,0,1,&vertFlushBarrier,0,0,1,
             (RefBase<vk::VkCommandBuffer_s_*> *)&bindingOffset);
  vertFlushBarrier._0_8_ = local_ab8._0_8_;
  vertFlushBarrier.pNext = (void *)local_ab8._8_8_;
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2b);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)local_b28.m_data.object.m_internal;
  VStack_c90.m_internal = local_a88.m_data.object.m_internal;
  local_c88 = 0;
  dStack_c80 = 0x10000000100;
  local_c78 = (RefBase<vk::VkCommandBuffer_s_*> *)CONCAT44(local_c78._4_4_,1);
  pVStack_c70 = &vertFlushBarrier;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_c58.m_data.object,&bindingOffset,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_c58.m_data.object,0,local_a68.m_data.object.m_internal);
  bindingOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_c58.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_c58.m_data.object,3,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_c58.m_data.object);
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2d);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x80000000100;
  VStack_c90.m_internal = 0x600000002;
  local_c88 = CONCAT44(queueFamilyIndex,queueFamilyIndex);
  dStack_c80 = local_bf8.m_data.object.m_internal;
  local_c78 = (RefBase<vk::VkCommandBuffer_s_*> *)0x1;
  pVStack_c70 = (VkMemoryBarrier *)0x1;
  local_c68 = CONCAT44(local_c68._4_4_,1);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_c58.m_data.object,0x8000,0x1000,0,0,0,0,0,1,&bindingOffset);
  bindingOffset = 0;
  pDStack_ca0 = (DeviceInterface *)0x10000000100;
  local_c98 = (VkDevice)0x1;
  VStack_c90.m_internal = (deUint64)&DAT_100000000;
  local_c88 = 0;
  dStack_c80 = 0x10000000000;
  local_c78 = (RefBase<vk::VkCommandBuffer_s_*> *)0x100000100;
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_c58.m_data.object,local_bf8.m_data.object.m_internal,6,
             local_b88.m_data.object.m_internal,1,&bindingOffset);
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2c);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)0x200000001000;
  VStack_c90.m_internal._4_4_ = queueFamilyIndex;
  VStack_c90.m_internal._0_4_ = queueFamilyIndex;
  local_c88 = local_b88.m_data.object.m_internal;
  dStack_c80 = 0;
  local_c78 = (RefBase<vk::VkCommandBuffer_s_*> *)0x40000;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_c58.m_data.object,0x1000,0x4000,0,0,0,1,&bindingOffset,0,0);
  VVar4 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_c58.m_data.object);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*cmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x359);
  bindingOffset = CONCAT44(bindingOffset._4_4_,6);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)
              ((vertexBufferMemory.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_memory).m_internal;
  VStack_c90.m_internal = 0;
  local_c88 = 0x30;
  pfVar2 = (float *)(vertexBufferMemory.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_hostPtr;
  pfVar2[4] = (float)local_958;
  pfVar2[5] = local_958._4_4_;
  pfVar2[6] = (float)uStack_950;
  pfVar2[7] = uStack_950._4_4_;
  pfVar2[8] = (float)local_948;
  pfVar2[9] = local_948._4_4_;
  pfVar2[10] = (float)uStack_940;
  pfVar2[0xb] = uStack_940._4_4_;
  *pfVar2 = local_968.m_data[0];
  pfVar2[1] = local_968.m_data[1];
  pfVar2[2] = local_968.m_data[2];
  pfVar2[3] = local_968.m_data[3];
  VVar4 = (*vk->_vptr_DeviceInterface[9])(vk,device,1);
  ::vk::checkResult(VVar4,"vk.flushMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x368);
  fenceParams.flags = 0;
  fenceParams._20_4_ = 0;
  fenceParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceParams._4_4_ = 0;
  fenceParams.pNext = (void *)0x0;
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c88 = 0;
  pVStack_c70 = (VkMemoryBarrier *)0x0;
  local_c98 = (VkDevice)0x0;
  VStack_c90.m_internal = 0;
  local_c68 = 0;
  bindingOffset = 4;
  dStack_c80 = 1;
  local_c78 = &local_c58;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&refImage,vk,device,&fenceParams,
                    (VkAllocationCallbacks *)0x0);
  vertFlushBarrier.srcAccessMask = refImage.m_size.m_data[2];
  vertFlushBarrier.dstAccessMask = refImage._20_4_;
  vertFlushBarrier.sType = refImage.m_format.order;
  vertFlushBarrier._4_4_ = refImage.m_format.type;
  vertFlushBarrier.pNext = (void *)refImage.m_size.m_data._0_8_;
  refImage.m_format.order = R;
  refImage.m_format.type = SNORM_INT8;
  refImage.m_size.m_data[0] = 0;
  refImage.m_size.m_data[1] = 0;
  refImage.m_size.m_data[2] = 0;
  refImage._20_4_ = 0;
  refImage.m_data.m_ptr = (void *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&refImage);
  VVar4 = (*vk->_vptr_DeviceInterface[2])(vk,local_b58,1,&bindingOffset,vertFlushBarrier._0_8_);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x381);
  VVar4 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&vertFlushBarrier,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x382);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&vertFlushBarrier);
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  bindingOffset = CONCAT44(bindingOffset._4_4_,6);
  pDStack_ca0 = (DeviceInterface *)0x0;
  local_c98 = (VkDevice)
              ((readImageBufferMemory.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_memory).m_internal;
  VStack_c90.m_internal = 0;
  local_c88 = 0x40000;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&vertFlushBarrier,&tcuFormat,0x100,0x100,1,
             (readImageBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  VVar4 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&bindingOffset);
  ::vk::checkResult(VVar4,"vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x392);
  tcu::TextureLevel::TextureLevel(&refImage,&tcuFormat,0x100,0x100,1);
  tcu::Vector<unsigned_int,_4>::Vector(&threshold,0);
  posDeviation.m_data[0] = 1;
  posDeviation.m_data[1] = 1;
  posDeviation.m_data[2] = 0;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  __return_storage_ptr___00 = local_b60;
  tcu::clear((PixelBufferAccess *)&fenceParams,(Vec4 *)local_ab8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  renderReferenceTriangle((PixelBufferAccess *)&fenceParams,(Vec4 (*) [3])&local_968);
  log = local_c30->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  bVar3 = tcu::intThresholdPositionDeviationCompare
                    (log,"ComparisonResult","Image comparison result",
                     (ConstPixelBufferAccess *)&fenceParams,
                     (ConstPixelBufferAccess *)&vertFlushBarrier,&threshold,&posDeviation,false,
                     COMPARE_LOG_RESULT);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fenceParams,"Rendering succeeded",&local_cad);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&fenceParams);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fenceParams,"Image comparison failed",&local_cad);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&fenceParams);
  }
  std::__cxx11::string::~string((string *)&fenceParams);
  tcu::TextureLevel::~TextureLevel(&refImage);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_c58);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_aa8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_a88);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_a68);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_a48);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_a28);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_a08);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_9e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_b28);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&imageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_bf8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&readImageBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_b88);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&vertexBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_b08);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus renderTriangleTest (Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	SimpleAllocator							memAlloc				(vk, vkDevice, getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()));
	const tcu::IVec2						renderSize				(256, 256);
	const VkFormat							colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const tcu::Vec4							clearColor				(0.125f, 0.25f, 0.75f, 1.0f);

	const tcu::Vec4							vertices[]				=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	const VkBufferCreateInfo				vertexBufferParams		=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		(VkDeviceSize)sizeof(vertices),			// size
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		1u,										// queueFamilyIndexCount
		&queueFamilyIndex,						// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					vertexBuffer			(createBuffer(vk, vkDevice, &vertexBufferParams));
	const UniquePtr<Allocation>				vertexBufferMemory		(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

	const VkDeviceSize						imageSizeBytes			= (VkDeviceSize)(sizeof(deUint32)*renderSize.x()*renderSize.y());
	const VkBufferCreateInfo				readImageBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// sType
		DE_NULL,									// pNext
		(VkBufferCreateFlags)0u,					// flags
		imageSizeBytes,								// size
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// usage
		VK_SHARING_MODE_EXCLUSIVE,					// sharingMode
		1u,											// queueFamilyIndexCount
		&queueFamilyIndex,							// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					readImageBuffer			(createBuffer(vk, vkDevice, &readImageBufferParams));
	const UniquePtr<Allocation>				readImageBufferMemory	(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *readImageBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset()));

	const VkImageCreateInfo					imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,									// sType
		DE_NULL,																// pNext
		0u,																		// flags
		VK_IMAGE_TYPE_2D,														// imageType
		VK_FORMAT_R8G8B8A8_UNORM,												// format
		{ (deUint32)renderSize.x(), (deUint32)renderSize.y(), 1 },				// extent
		1u,																		// mipLevels
		1u,																		// arraySize
		VK_SAMPLE_COUNT_1_BIT,													// samples
		VK_IMAGE_TILING_OPTIMAL,												// tiling
		VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|VK_IMAGE_USAGE_TRANSFER_SRC_BIT,	// usage
		VK_SHARING_MODE_EXCLUSIVE,												// sharingMode
		1u,																		// queueFamilyIndexCount
		&queueFamilyIndex,														// pQueueFamilyIndices
		VK_IMAGE_LAYOUT_UNDEFINED,												// initialLayout
	};

	const Unique<VkImage>					image					(createImage(vk, vkDevice, &imageParams));
	const UniquePtr<Allocation>				imageMemory				(memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any));

	VK_CHECK(vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset()));

	const VkAttachmentDescription			colorAttDesc			=
	{
		0u,												// flags
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		VK_SAMPLE_COUNT_1_BIT,							// samples
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// loadOp
		VK_ATTACHMENT_STORE_OP_STORE,					// storeOp
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// stencilLoadOp
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// stencilStoreOp
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// initialLayout
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// finalLayout
	};
	const VkAttachmentReference				colorAttRef				=
	{
		0u,												// attachment
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// layout
	};
	const VkSubpassDescription				subpassDesc				=
	{
		(VkSubpassDescriptionFlags)0u,					// flags
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// pipelineBindPoint
		0u,												// inputAttachmentCount
		DE_NULL,										// pInputAttachments
		1u,												// colorAttachmentCount
		&colorAttRef,									// pColorAttachments
		DE_NULL,										// pResolveAttachments
		DE_NULL,										// depthStencilAttachment
		0u,												// preserveAttachmentCount
		DE_NULL,										// pPreserveAttachments
	};
	const VkRenderPassCreateInfo			renderPassParams		=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		1u,												// attachmentCount
		&colorAttDesc,									// pAttachments
		1u,												// subpassCount
		&subpassDesc,									// pSubpasses
		0u,												// dependencyCount
		DE_NULL,										// pDependencies
	};
	const Unique<VkRenderPass>				renderPass				(createRenderPass(vk, vkDevice, &renderPassParams));

	const VkImageViewCreateInfo				colorAttViewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		*image,											// image
		VK_IMAGE_VIEW_TYPE_2D,							// viewType
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		{
			VK_COMPONENT_SWIZZLE_R,
			VK_COMPONENT_SWIZZLE_G,
			VK_COMPONENT_SWIZZLE_B,
			VK_COMPONENT_SWIZZLE_A
		},												// components
		{
			VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
			0u,												// baseMipLevel
			1u,												// levelCount
			0u,												// baseArrayLayer
			1u,												// layerCount
		},												// subresourceRange
	};
	const Unique<VkImageView>				colorAttView			(createImageView(vk, vkDevice, &colorAttViewParams));

	// Pipeline layout
	const VkPipelineLayoutCreateInfo		pipelineLayoutParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,			// sType
		DE_NULL,												// pNext
		(vk::VkPipelineLayoutCreateFlags)0,
		0u,														// setLayoutCount
		DE_NULL,												// pSetLayouts
		0u,														// pushConstantRangeCount
		DE_NULL,												// pPushConstantRanges
	};
	const Unique<VkPipelineLayout>			pipelineLayout			(createPipelineLayout(vk, vkDevice, &pipelineLayoutParams));

	// Shaders
	const Unique<VkShaderModule>			vertShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("vert"), 0));
	const Unique<VkShaderModule>			fragShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("frag"), 0));

	// Pipeline
	const VkSpecializationInfo				emptyShaderSpecParams	=
	{
		0u,														// mapEntryCount
		DE_NULL,												// pMap
		0,														// dataSize
		DE_NULL,												// pData
	};
	const VkPipelineShaderStageCreateInfo	shaderStageParams[]	=
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_VERTEX_BIT,								// stage
			*vertShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_FRAGMENT_BIT,							// stage
			*fragShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		}
	};
	const VkPipelineDepthStencilStateCreateInfo	depthStencilParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// depthTestEnable
		DE_FALSE,													// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,										// depthCompareOp
		DE_FALSE,													// depthBoundsTestEnable
		DE_FALSE,													// stencilTestEnable
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// front
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// back;
		0.0f,														//	float				minDepthBounds;
		1.0f,														//	float				maxDepthBounds;
	};
	const VkViewport						viewport0				=
	{
		0.0f,														// x
		0.0f,														// y
		(float)renderSize.x(),										// width
		(float)renderSize.y(),										// height
		0.0f,														// minDepth
		1.0f,														// maxDepth
	};
	const VkRect2D							scissor0				=
	{
		{
			0u,															// x
			0u,															// y
		},															// offset
		{
			(deUint32)renderSize.x(),									// width
			(deUint32)renderSize.y(),									// height
		},															// extent;
	};
	const VkPipelineViewportStateCreateInfo		viewportParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,		// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// viewportCount
		&viewport0,													// pViewports
		1u,															// scissorCount
		&scissor0													// pScissors
	};
	const VkSampleMask							sampleMask				= ~0u;
	const VkPipelineMultisampleStateCreateInfo	multisampleParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_SAMPLE_COUNT_1_BIT,										// rasterizationSamples
		VK_FALSE,													// sampleShadingEnable
		0.0f,														// minSampleShading
		&sampleMask,												// sampleMask
		VK_FALSE,													// alphaToCoverageEnable
		VK_FALSE,													// alphaToOneEnable
	};
	const VkPipelineRasterizationStateCreateInfo	rasterParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_TRUE,													// depthClampEnable
		VK_FALSE,													// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,										// polygonMode
		VK_CULL_MODE_NONE,											// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// frontFace
		VK_FALSE,													// depthBiasEnable
		0.0f,														// depthBiasConstantFactor
		0.0f,														// depthBiasClamp
		0.0f,														// depthBiasSlopeFactor
		1.0f,														// lineWidth
	};
	const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,														// pNext
		0u,																// flags
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		DE_FALSE,														// primitiveRestartEnable
	};
	const VkVertexInputBindingDescription		vertexBinding0			=
	{
		0u,														// binding
		(deUint32)sizeof(tcu::Vec4),							// stride
		VK_VERTEX_INPUT_RATE_VERTEX,							// inputRate
	};
	const VkVertexInputAttributeDescription		vertexAttrib0			=
	{
		0u,														// location
		0u,														// binding
		VK_FORMAT_R32G32B32A32_SFLOAT,							// format
		0u,														// offset
	};
	const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// vertexBindingDescriptionCount
		&vertexBinding0,											// pVertexBindingDescriptions
		1u,															// vertexAttributeDescriptionCount
		&vertexAttrib0,												// pVertexAttributeDescriptions
	};
	const VkPipelineColorBlendAttachmentState	attBlendParams			=
	{
		VK_FALSE,													// blendEnable
		VK_BLEND_FACTOR_ONE,										// srcColorBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstColorBlendFactor
		VK_BLEND_OP_ADD,											// colorBlendOp
		VK_BLEND_FACTOR_ONE,										// srcAlphaBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstAlphaBlendFactor
		VK_BLEND_OP_ADD,											// alphaBlendOp
		(VK_COLOR_COMPONENT_R_BIT|
		 VK_COLOR_COMPONENT_G_BIT|
		 VK_COLOR_COMPONENT_B_BIT|
		 VK_COLOR_COMPONENT_A_BIT),									// colorWriteMask
	};
	const VkPipelineColorBlendStateCreateInfo	blendParams				=
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// logicOpEnable
		VK_LOGIC_OP_COPY,											// logicOp
		1u,															// attachmentCount
		&attBlendParams,											// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// blendConstants[4]
	};
	const VkGraphicsPipelineCreateInfo		pipelineParams			=
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,		// sType
		DE_NULL,												// pNext
		0u,														// flags
		(deUint32)DE_LENGTH_OF_ARRAY(shaderStageParams),		// stageCount
		shaderStageParams,										// pStages
		&vertexInputStateParams,								// pVertexInputState
		&inputAssemblyParams,									// pInputAssemblyState
		DE_NULL,												// pTessellationState
		&viewportParams,										// pViewportState
		&rasterParams,											// pRasterizationState
		&multisampleParams,										// pMultisampleState
		&depthStencilParams,									// pDepthStencilState
		&blendParams,											// pColorBlendState
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,		// pDynamicState
		*pipelineLayout,										// layout
		*renderPass,											// renderPass
		0u,														// subpass
		DE_NULL,												// basePipelineHandle
		0u,														// basePipelineIndex
	};

	const Unique<VkPipeline>				pipeline				(createGraphicsPipeline(vk, vkDevice, DE_NULL, &pipelineParams));

	// Framebuffer
	const VkFramebufferCreateInfo			framebufferParams		=
	{
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,				// sType
		DE_NULL,												// pNext
		0u,														// flags
		*renderPass,											// renderPass
		1u,														// attachmentCount
		&*colorAttView,											// pAttachments
		(deUint32)renderSize.x(),								// width
		(deUint32)renderSize.y(),								// height
		1u,														// layers
	};
	const Unique<VkFramebuffer>				framebuffer				(createFramebuffer(vk, vkDevice, &framebufferParams));

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags
		queueFamilyIndex,											// queueFamilyIndex
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,			// sType
		DE_NULL,												// pNext
		*cmdPool,												// pool
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,						// level
		1u,														// bufferCount
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			cmdBufBeginParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// sType
		DE_NULL,												// pNext
		0u,														// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Record commands
	VK_CHECK(vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams));

	{
		const VkMemoryBarrier		vertFlushBarrier	=
		{
			VK_STRUCTURE_TYPE_MEMORY_BARRIER,			// sType
			DE_NULL,									// pNext
			VK_ACCESS_HOST_WRITE_BIT,					// srcAccessMask
			VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT,		// dstAccessMask
		};
		const VkImageMemoryBarrier	colorAttBarrier		=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			0u,											// srcAccessMask
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),		// dstAccessMask
			VK_IMAGE_LAYOUT_UNDEFINED,					// oldLayout
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// levelCount
				0u,											// baseArrayLayer
				1u,											// layerCount
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, (VkDependencyFlags)0, 1, &vertFlushBarrier, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &colorAttBarrier);
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(clearColor[0],
																			 clearColor[1],
																			 clearColor[2],
																			 clearColor[3]);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,			// sType
			DE_NULL,											// pNext
			*renderPass,										// renderPass
			*framebuffer,										// framebuffer
			{
				{ 0, 0 },
				{ (deUint32)renderSize.x(), (deUint32)renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		vk.cmdBeginRenderPass(*cmdBuf, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	vk.cmdBindPipeline(*cmdBuf, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkDeviceSize bindingOffset = 0;
		vk.cmdBindVertexBuffers(*cmdBuf, 0u, 1u, &vertexBuffer.get(), &bindingOffset);
	}
	vk.cmdDraw(*cmdBuf, 3u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuf);

	{
		const VkImageMemoryBarrier	renderFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// outputMask
			VK_ACCESS_TRANSFER_READ_BIT,				// inputMask
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// oldLayout
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// mipLevels
				0u,											// baseArraySlice
				1u,											// arraySize
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &renderFinishBarrier);
	}

	{
		const VkBufferImageCopy	copyParams	=
		{
			(VkDeviceSize)0u,						// bufferOffset
			(deUint32)renderSize.x(),				// bufferRowLength
			(deUint32)renderSize.y(),				// bufferImageHeight
			{
				VK_IMAGE_ASPECT_COLOR_BIT,				// aspectMask
				0u,										// mipLevel
				0u,										// baseArrayLayer
				1u,										// layerCount
			},										// imageSubresource
			{ 0u, 0u, 0u },							// imageOffset
			{
				(deUint32)renderSize.x(),
				(deUint32)renderSize.y(),
				1u
			}										// imageExtent
		};
		vk.cmdCopyImageToBuffer(*cmdBuf, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	{
		const VkBufferMemoryBarrier	copyFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// sType
			DE_NULL,									// pNext
			VK_ACCESS_TRANSFER_WRITE_BIT,				// srcAccessMask
			VK_ACCESS_HOST_READ_BIT,					// dstAccessMask
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*readImageBuffer,							// buffer
			0u,											// offset
			imageSizeBytes								// size
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuf));

	// Upload vertex data
	{
		const VkMappedMemoryRange	range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			vertexBufferMemory->getMemory(),		// memory
			0,										// offset
			(VkDeviceSize)sizeof(vertices),			// size
		};
		void*						vertexBufPtr	= vertexBufferMemory->getHostPtr();

		deMemcpy(vertexBufPtr, &vertices[0], sizeof(vertices));
		VK_CHECK(vk.flushMappedMemoryRanges(vkDevice, 1u, &range));
	}

	// Submit & wait for completion
	{
		const VkFenceCreateInfo	fenceParams	=
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// sType
			DE_NULL,								// pNext
			0u,										// flags
		};
		const VkSubmitInfo		submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,
			1u,										// commandBufferCount
			&cmdBuf.get(),							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL,								// pSignalSemaphores
		};
		const Unique<VkFence>	fence		(createFence(vk, vkDevice, &fenceParams));

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read results, render reference, compare
	{
		const tcu::TextureFormat			tcuFormat		= vk::mapVkFormat(colorFormat);
		const VkMappedMemoryRange			range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			readImageBufferMemory->getMemory(),		// memory
			0,										// offset
			imageSizeBytes,							// size
		};
		const tcu::ConstPixelBufferAccess	resultAccess	(tcuFormat, renderSize.x(), renderSize.y(), 1, readImageBufferMemory->getHostPtr());

		VK_CHECK(vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range));

		{
			tcu::TextureLevel	refImage		(tcuFormat, renderSize.x(), renderSize.y());
			const tcu::UVec4	threshold		(0u);
			const tcu::IVec3	posDeviation	(1,1,0);

			tcu::clear(refImage.getAccess(), clearColor);
			renderReferenceTriangle(refImage.getAccess(), vertices);

			if (tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(),
														  "ComparisonResult",
														  "Image comparison result",
														  refImage.getAccess(),
														  resultAccess,
														  threshold,
														  posDeviation,
														  false,
														  tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::pass("Rendering succeeded");
			else
				return tcu::TestStatus::fail("Image comparison failed");
		}
	}

	return tcu::TestStatus::pass("Rendering succeeded");
}